

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.pb.cc
# Opt level: O1

bool __thiscall
google::protobuf::FileDescriptorProto::MergePartialFromCodedStream
          (FileDescriptorProto *this,CodedInputStream *input)

{
  int *piVar1;
  uint8 *puVar2;
  byte *pbVar3;
  uint8 uVar4;
  int iVar5;
  int iVar6;
  undefined8 *puVar7;
  void **ppvVar8;
  bool bVar9;
  bool bVar10;
  Limit LVar11;
  uint8 *puVar12;
  string *psVar13;
  DescriptorProto *this_00;
  EnumDescriptorProto *this_01;
  ServiceDescriptorProto *this_02;
  FieldDescriptorProto *this_03;
  FileOptions *pFVar14;
  SourceCodeInfo *pSVar15;
  LogMessage *pLVar16;
  uint32 tag;
  int iVar17;
  int value;
  uint32 local_f0;
  undefined4 local_ec;
  uint32 local_e8;
  uint32 local_e4;
  RepeatedField<int> *local_e0;
  RepeatedField<int> *local_d8;
  RepeatedPtrFieldBase *local_d0;
  RepeatedPtrFieldBase *local_c8;
  RepeatedPtrFieldBase *local_c0;
  RepeatedPtrFieldBase *local_b8;
  RepeatedPtrFieldBase *local_b0;
  UnknownFieldSet *local_a8;
  LogMessage local_a0;
  LogMessage local_68;
  
  local_d8 = &this->weak_dependency_;
  local_e0 = &this->public_dependency_;
  local_b0 = &(this->dependency_).super_RepeatedPtrFieldBase;
  local_b8 = &(this->message_type_).super_RepeatedPtrFieldBase;
  local_c0 = &(this->enum_type_).super_RepeatedPtrFieldBase;
  local_c8 = &(this->service_).super_RepeatedPtrFieldBase;
  local_d0 = &(this->extension_).super_RepeatedPtrFieldBase;
  local_a8 = &this->_unknown_fields_;
LAB_001e5a45:
  puVar12 = input->buffer_;
  if ((puVar12 < input->buffer_end_) && (tag = (uint32)(char)*puVar12, -1 < (char)*puVar12)) {
    input->last_tag_ = tag;
    puVar12 = puVar12 + 1;
    input->buffer_ = puVar12;
  }
  else {
    tag = io::CodedInputStream::ReadTagFallback(input);
    puVar12 = (uint8 *)(ulong)tag;
    input->last_tag_ = tag;
  }
  local_ec = (undefined4)CONCAT71((int7)((ulong)puVar12 >> 8),1);
  if (tag == 0) goto LAB_001e66ae;
  switch(tag >> 3) {
  case 1:
    if ((tag & 7) == 2) {
      *(byte *)this->_has_bits_ = (byte)this->_has_bits_[0] | 1;
      if (this->name_ == (string *)internal::kEmptyString_abi_cxx11_) {
        psVar13 = (string *)operator_new(0x20);
        (psVar13->_M_dataplus)._M_p = (pointer)&psVar13->field_2;
        psVar13->_M_string_length = 0;
        (psVar13->field_2)._M_local_buf[0] = '\0';
        this->name_ = psVar13;
      }
      bVar10 = internal::WireFormatLite::ReadString(input,this->name_);
      if (!bVar10) goto LAB_001e66a6;
      internal::WireFormat::VerifyUTF8StringFallback
                ((this->name_->_M_dataplus)._M_p,(int)this->name_->_M_string_length,PARSE);
      puVar12 = input->buffer_;
      if ((puVar12 < input->buffer_end_) && (*puVar12 == '\x12')) {
        input->buffer_ = puVar12 + 1;
        goto LAB_001e5bb1;
      }
      goto LAB_001e5a45;
    }
    break;
  case 2:
    if ((tag & 7) == 2) {
LAB_001e5bb1:
      *(byte *)this->_has_bits_ = (byte)this->_has_bits_[0] | 2;
      if (this->package_ == (string *)internal::kEmptyString_abi_cxx11_) {
        psVar13 = (string *)operator_new(0x20);
        (psVar13->_M_dataplus)._M_p = (pointer)&psVar13->field_2;
        psVar13->_M_string_length = 0;
        (psVar13->field_2)._M_local_buf[0] = '\0';
        this->package_ = psVar13;
      }
      bVar10 = internal::WireFormatLite::ReadString(input,this->package_);
      if (!bVar10) goto LAB_001e66a6;
      internal::WireFormat::VerifyUTF8StringFallback
                ((this->package_->_M_dataplus)._M_p,(int)this->package_->_M_string_length,PARSE);
      puVar12 = input->buffer_;
      if ((puVar12 < input->buffer_end_) && (*puVar12 == '\x1a')) {
        do {
          input->buffer_ = puVar12 + 1;
LAB_001e5caa:
          iVar5 = (this->dependency_).super_RepeatedPtrFieldBase.current_size_;
          iVar6 = (this->dependency_).super_RepeatedPtrFieldBase.allocated_size_;
          if (iVar5 < iVar6) {
            ppvVar8 = (this->dependency_).super_RepeatedPtrFieldBase.elements_;
            (this->dependency_).super_RepeatedPtrFieldBase.current_size_ = iVar5 + 1;
            psVar13 = (string *)ppvVar8[iVar5];
          }
          else {
            iVar5 = (this->dependency_).super_RepeatedPtrFieldBase.total_size_;
            if (iVar6 == iVar5) {
              internal::RepeatedPtrFieldBase::Reserve(local_b0,iVar5 + 1);
            }
            piVar1 = &(this->dependency_).super_RepeatedPtrFieldBase.allocated_size_;
            *piVar1 = *piVar1 + 1;
            psVar13 = internal::StringTypeHandlerBase::New_abi_cxx11_();
            ppvVar8 = (this->dependency_).super_RepeatedPtrFieldBase.elements_;
            iVar5 = (this->dependency_).super_RepeatedPtrFieldBase.current_size_;
            (this->dependency_).super_RepeatedPtrFieldBase.current_size_ = iVar5 + 1;
            ppvVar8[iVar5] = psVar13;
          }
          bVar10 = internal::WireFormatLite::ReadString(input,psVar13);
          if (!bVar10) goto LAB_001e66a6;
          puVar7 = (undefined8 *)
                   (this->dependency_).super_RepeatedPtrFieldBase.elements_
                   [(long)(this->dependency_).super_RepeatedPtrFieldBase.current_size_ + -1];
          internal::WireFormat::VerifyUTF8StringFallback((char *)*puVar7,*(int *)(puVar7 + 1),PARSE)
          ;
          puVar12 = input->buffer_;
        } while ((puVar12 < input->buffer_end_) && (*puVar12 == '\x1a'));
        puVar12 = input->buffer_;
        if ((puVar12 < input->buffer_end_) && (*puVar12 == '\"')) {
          do {
            input->buffer_ = puVar12 + 1;
LAB_001e5d57:
            iVar5 = (this->message_type_).super_RepeatedPtrFieldBase.current_size_;
            iVar6 = (this->message_type_).super_RepeatedPtrFieldBase.allocated_size_;
            if (iVar5 < iVar6) {
              ppvVar8 = (this->message_type_).super_RepeatedPtrFieldBase.elements_;
              (this->message_type_).super_RepeatedPtrFieldBase.current_size_ = iVar5 + 1;
              this_00 = (DescriptorProto *)ppvVar8[iVar5];
            }
            else {
              iVar5 = (this->message_type_).super_RepeatedPtrFieldBase.total_size_;
              if (iVar6 == iVar5) {
                internal::RepeatedPtrFieldBase::Reserve(local_b8,iVar5 + 1);
              }
              piVar1 = &(this->message_type_).super_RepeatedPtrFieldBase.allocated_size_;
              *piVar1 = *piVar1 + 1;
              this_00 = internal::GenericTypeHandler<google::protobuf::DescriptorProto>::New();
              ppvVar8 = (this->message_type_).super_RepeatedPtrFieldBase.elements_;
              iVar5 = (this->message_type_).super_RepeatedPtrFieldBase.current_size_;
              (this->message_type_).super_RepeatedPtrFieldBase.current_size_ = iVar5 + 1;
              ppvVar8[iVar5] = this_00;
            }
            puVar12 = input->buffer_;
            if ((puVar12 < input->buffer_end_) && (uVar4 = *puVar12, -1 < (char)uVar4)) {
              input->buffer_ = puVar12 + 1;
              local_f0 = (int)(char)uVar4;
            }
            else {
              bVar10 = io::CodedInputStream::ReadVarint32Fallback(input,&local_f0);
              if (!bVar10) goto LAB_001e66a6;
            }
            iVar5 = input->recursion_depth_;
            input->recursion_depth_ = iVar5 + 1;
            if (input->recursion_limit_ <= iVar5) goto LAB_001e66a6;
            LVar11 = io::CodedInputStream::PushLimit(input,local_f0);
            bVar10 = DescriptorProto::MergePartialFromCodedStream(this_00,input);
            if ((!bVar10) || (input->legitimate_message_end_ != true)) goto LAB_001e66a6;
            io::CodedInputStream::PopLimit(input,LVar11);
            if (0 < input->recursion_depth_) {
              input->recursion_depth_ = input->recursion_depth_ + -1;
            }
            puVar12 = input->buffer_;
          } while ((puVar12 < input->buffer_end_) && (*puVar12 == '\"'));
          puVar12 = input->buffer_;
          if ((puVar12 < input->buffer_end_) && (*puVar12 == '*')) {
            do {
              input->buffer_ = puVar12 + 1;
LAB_001e5e62:
              iVar5 = (this->enum_type_).super_RepeatedPtrFieldBase.current_size_;
              iVar6 = (this->enum_type_).super_RepeatedPtrFieldBase.allocated_size_;
              if (iVar5 < iVar6) {
                ppvVar8 = (this->enum_type_).super_RepeatedPtrFieldBase.elements_;
                (this->enum_type_).super_RepeatedPtrFieldBase.current_size_ = iVar5 + 1;
                this_01 = (EnumDescriptorProto *)ppvVar8[iVar5];
              }
              else {
                iVar5 = (this->enum_type_).super_RepeatedPtrFieldBase.total_size_;
                if (iVar6 == iVar5) {
                  internal::RepeatedPtrFieldBase::Reserve(local_c0,iVar5 + 1);
                }
                piVar1 = &(this->enum_type_).super_RepeatedPtrFieldBase.allocated_size_;
                *piVar1 = *piVar1 + 1;
                this_01 = internal::GenericTypeHandler<google::protobuf::EnumDescriptorProto>::New()
                ;
                ppvVar8 = (this->enum_type_).super_RepeatedPtrFieldBase.elements_;
                iVar5 = (this->enum_type_).super_RepeatedPtrFieldBase.current_size_;
                (this->enum_type_).super_RepeatedPtrFieldBase.current_size_ = iVar5 + 1;
                ppvVar8[iVar5] = this_01;
              }
              puVar12 = input->buffer_;
              if ((puVar12 < input->buffer_end_) && (uVar4 = *puVar12, -1 < (char)uVar4)) {
                input->buffer_ = puVar12 + 1;
                local_f0 = (int)(char)uVar4;
              }
              else {
                bVar10 = io::CodedInputStream::ReadVarint32Fallback(input,&local_f0);
                if (!bVar10) goto LAB_001e66a6;
              }
              iVar5 = input->recursion_depth_;
              input->recursion_depth_ = iVar5 + 1;
              if (input->recursion_limit_ <= iVar5) goto LAB_001e66a6;
              LVar11 = io::CodedInputStream::PushLimit(input,local_f0);
              bVar10 = EnumDescriptorProto::MergePartialFromCodedStream(this_01,input);
              if ((!bVar10) || (input->legitimate_message_end_ != true)) goto LAB_001e66a6;
              io::CodedInputStream::PopLimit(input,LVar11);
              if (0 < input->recursion_depth_) {
                input->recursion_depth_ = input->recursion_depth_ + -1;
              }
              puVar12 = input->buffer_;
            } while ((puVar12 < input->buffer_end_) && (*puVar12 == '*'));
            puVar12 = input->buffer_;
            if ((puVar12 < input->buffer_end_) && (*puVar12 == '2')) {
              do {
                input->buffer_ = puVar12 + 1;
LAB_001e5f70:
                iVar5 = (this->service_).super_RepeatedPtrFieldBase.current_size_;
                iVar6 = (this->service_).super_RepeatedPtrFieldBase.allocated_size_;
                if (iVar5 < iVar6) {
                  ppvVar8 = (this->service_).super_RepeatedPtrFieldBase.elements_;
                  (this->service_).super_RepeatedPtrFieldBase.current_size_ = iVar5 + 1;
                  this_02 = (ServiceDescriptorProto *)ppvVar8[iVar5];
                }
                else {
                  iVar5 = (this->service_).super_RepeatedPtrFieldBase.total_size_;
                  if (iVar6 == iVar5) {
                    internal::RepeatedPtrFieldBase::Reserve(local_c8,iVar5 + 1);
                  }
                  piVar1 = &(this->service_).super_RepeatedPtrFieldBase.allocated_size_;
                  *piVar1 = *piVar1 + 1;
                  this_02 = internal::GenericTypeHandler<google::protobuf::ServiceDescriptorProto>::
                            New();
                  ppvVar8 = (this->service_).super_RepeatedPtrFieldBase.elements_;
                  iVar5 = (this->service_).super_RepeatedPtrFieldBase.current_size_;
                  (this->service_).super_RepeatedPtrFieldBase.current_size_ = iVar5 + 1;
                  ppvVar8[iVar5] = this_02;
                }
                puVar12 = input->buffer_;
                if ((puVar12 < input->buffer_end_) && (uVar4 = *puVar12, -1 < (char)uVar4)) {
                  input->buffer_ = puVar12 + 1;
                  local_f0 = (int)(char)uVar4;
                }
                else {
                  bVar10 = io::CodedInputStream::ReadVarint32Fallback(input,&local_f0);
                  if (!bVar10) goto LAB_001e66a6;
                }
                iVar5 = input->recursion_depth_;
                input->recursion_depth_ = iVar5 + 1;
                if (input->recursion_limit_ <= iVar5) goto LAB_001e66a6;
                LVar11 = io::CodedInputStream::PushLimit(input,local_f0);
                bVar10 = ServiceDescriptorProto::MergePartialFromCodedStream(this_02,input);
                if ((!bVar10) || (input->legitimate_message_end_ != true)) goto LAB_001e66a6;
                io::CodedInputStream::PopLimit(input,LVar11);
                if (0 < input->recursion_depth_) {
                  input->recursion_depth_ = input->recursion_depth_ + -1;
                }
                puVar12 = input->buffer_;
              } while ((puVar12 < input->buffer_end_) && (*puVar12 == '2'));
              puVar12 = input->buffer_;
              if ((puVar12 < input->buffer_end_) && (*puVar12 == ':')) {
                do {
                  input->buffer_ = puVar12 + 1;
LAB_001e6096:
                  iVar5 = (this->extension_).super_RepeatedPtrFieldBase.current_size_;
                  iVar6 = (this->extension_).super_RepeatedPtrFieldBase.allocated_size_;
                  if (iVar5 < iVar6) {
                    ppvVar8 = (this->extension_).super_RepeatedPtrFieldBase.elements_;
                    (this->extension_).super_RepeatedPtrFieldBase.current_size_ = iVar5 + 1;
                    this_03 = (FieldDescriptorProto *)ppvVar8[iVar5];
                  }
                  else {
                    iVar5 = (this->extension_).super_RepeatedPtrFieldBase.total_size_;
                    if (iVar6 == iVar5) {
                      internal::RepeatedPtrFieldBase::Reserve(local_d0,iVar5 + 1);
                    }
                    piVar1 = &(this->extension_).super_RepeatedPtrFieldBase.allocated_size_;
                    *piVar1 = *piVar1 + 1;
                    this_03 = internal::GenericTypeHandler<google::protobuf::FieldDescriptorProto>::
                              New();
                    ppvVar8 = (this->extension_).super_RepeatedPtrFieldBase.elements_;
                    iVar5 = (this->extension_).super_RepeatedPtrFieldBase.current_size_;
                    (this->extension_).super_RepeatedPtrFieldBase.current_size_ = iVar5 + 1;
                    ppvVar8[iVar5] = this_03;
                  }
                  puVar12 = input->buffer_;
                  if ((puVar12 < input->buffer_end_) && (uVar4 = *puVar12, -1 < (char)uVar4)) {
                    input->buffer_ = puVar12 + 1;
                    local_f0 = (int)(char)uVar4;
                  }
                  else {
                    bVar10 = io::CodedInputStream::ReadVarint32Fallback(input,&local_f0);
                    if (!bVar10) goto LAB_001e66a6;
                  }
                  iVar5 = input->recursion_depth_;
                  input->recursion_depth_ = iVar5 + 1;
                  if (input->recursion_limit_ <= iVar5) goto LAB_001e66a6;
                  LVar11 = io::CodedInputStream::PushLimit(input,local_f0);
                  bVar10 = FieldDescriptorProto::MergePartialFromCodedStream(this_03,input);
                  if ((!bVar10) || (input->legitimate_message_end_ != true)) goto LAB_001e66a6;
                  io::CodedInputStream::PopLimit(input,LVar11);
                  if (0 < input->recursion_depth_) {
                    input->recursion_depth_ = input->recursion_depth_ + -1;
                  }
                  puVar12 = input->buffer_;
                } while ((puVar12 < input->buffer_end_) && (*puVar12 == ':'));
                puVar12 = input->buffer_;
                if ((puVar12 < input->buffer_end_) && (*puVar12 == 'B')) {
                  input->buffer_ = puVar12 + 1;
                  goto LAB_001e61bc;
                }
              }
            }
          }
        }
      }
      goto LAB_001e5a45;
    }
    break;
  case 3:
    if ((tag & 7) == 2) goto LAB_001e5caa;
    break;
  case 4:
    if ((tag & 7) == 2) goto LAB_001e5d57;
    break;
  case 5:
    if ((tag & 7) == 2) goto LAB_001e5e62;
    break;
  case 6:
    if ((tag & 7) == 2) goto LAB_001e5f70;
    break;
  case 7:
    if ((tag & 7) == 2) goto LAB_001e6096;
    break;
  case 8:
    if ((tag & 7) == 2) {
LAB_001e61bc:
      pbVar3 = (byte *)((long)this->_has_bits_ + 1);
      *pbVar3 = *pbVar3 | 2;
      if (this->options_ == (FileOptions *)0x0) {
        pFVar14 = (FileOptions *)operator_new(0x88);
        FileOptions::FileOptions(pFVar14);
        this->options_ = pFVar14;
      }
      pFVar14 = this->options_;
      puVar12 = input->buffer_;
      if ((puVar12 < input->buffer_end_) && (uVar4 = *puVar12, -1 < (char)uVar4)) {
        input->buffer_ = puVar12 + 1;
        local_f0 = (int)(char)uVar4;
      }
      else {
        bVar10 = io::CodedInputStream::ReadVarint32Fallback(input,&local_f0);
        if (!bVar10) goto LAB_001e66a6;
      }
      iVar5 = input->recursion_depth_;
      input->recursion_depth_ = iVar5 + 1;
      if (input->recursion_limit_ <= iVar5) goto LAB_001e66a6;
      LVar11 = io::CodedInputStream::PushLimit(input,local_f0);
      bVar10 = FileOptions::MergePartialFromCodedStream(pFVar14,input);
      if ((bVar10) && (input->legitimate_message_end_ == true)) {
        io::CodedInputStream::PopLimit(input,LVar11);
        if (0 < input->recursion_depth_) {
          input->recursion_depth_ = input->recursion_depth_ + -1;
        }
        puVar12 = input->buffer_;
        if ((puVar12 < input->buffer_end_) && (*puVar12 == 'J')) {
          input->buffer_ = puVar12 + 1;
          goto LAB_001e6297;
        }
        goto LAB_001e5a45;
      }
      goto LAB_001e66a6;
    }
    break;
  case 9:
    if ((tag & 7) != 2) break;
LAB_001e6297:
    pbVar3 = (byte *)((long)this->_has_bits_ + 1);
    *pbVar3 = *pbVar3 | 4;
    if (this->source_code_info_ == (SourceCodeInfo *)0x0) {
      pSVar15 = (SourceCodeInfo *)operator_new(0x30);
      SourceCodeInfo::SourceCodeInfo(pSVar15);
      this->source_code_info_ = pSVar15;
    }
    pSVar15 = this->source_code_info_;
    puVar12 = input->buffer_;
    if ((puVar12 < input->buffer_end_) && (uVar4 = *puVar12, -1 < (char)uVar4)) {
      input->buffer_ = puVar12 + 1;
      local_f0 = (int)(char)uVar4;
    }
    else {
      bVar10 = io::CodedInputStream::ReadVarint32Fallback(input,&local_f0);
      if (!bVar10) goto LAB_001e66a6;
    }
    iVar5 = input->recursion_depth_;
    input->recursion_depth_ = iVar5 + 1;
    if (input->recursion_limit_ <= iVar5) goto LAB_001e66a6;
    LVar11 = io::CodedInputStream::PushLimit(input,local_f0);
    bVar10 = SourceCodeInfo::MergePartialFromCodedStream(pSVar15,input);
    if ((!bVar10) || (input->legitimate_message_end_ != true)) goto LAB_001e66a6;
    io::CodedInputStream::PopLimit(input,LVar11);
    if (0 < input->recursion_depth_) {
      input->recursion_depth_ = input->recursion_depth_ + -1;
    }
    puVar12 = input->buffer_;
    if ((puVar12 < input->buffer_end_) && (*puVar12 == 'P')) {
      do {
        input->buffer_ = puVar12 + 1;
LAB_001e6372:
        puVar12 = input->buffer_;
        if ((puVar12 < input->buffer_end_) && (uVar4 = *puVar12, -1 < (char)uVar4)) {
          input->buffer_ = puVar12 + 1;
          bVar10 = true;
          local_f0 = (int)(char)uVar4;
        }
        else {
          bVar10 = io::CodedInputStream::ReadVarint32Fallback(input,&local_f0);
        }
        bVar9 = false;
        if (bVar10 != false) {
          local_e8 = local_f0;
          iVar5 = (this->public_dependency_).total_size_;
          if ((this->public_dependency_).current_size_ == iVar5) {
            RepeatedField<int>::Reserve(local_e0,iVar5 + 1);
          }
          iVar5 = (this->public_dependency_).current_size_;
          (this->public_dependency_).current_size_ = iVar5 + 1;
          (this->public_dependency_).elements_[iVar5] = local_e8;
          iVar5 = (this->public_dependency_).total_size_;
          bVar9 = true;
          iVar6 = (this->public_dependency_).current_size_;
          iVar17 = iVar5 - iVar6;
          if (iVar17 != 0 && iVar6 <= iVar5) {
            iVar17 = iVar17 + 1;
            do {
              puVar12 = input->buffer_;
              if ((input->buffer_end_ <= puVar12) || (*puVar12 != 'P')) break;
              puVar2 = puVar12 + 1;
              input->buffer_ = puVar2;
              if ((puVar2 < input->buffer_end_) && (uVar4 = *puVar2, -1 < (char)uVar4)) {
                input->buffer_ = puVar12 + 2;
                bVar10 = true;
                local_f0 = (int)(char)uVar4;
              }
              else {
                bVar10 = io::CodedInputStream::ReadVarint32Fallback(input,&local_f0);
              }
              if (bVar10 == false) {
                bVar9 = false;
                goto LAB_001e64c8;
              }
              local_e8 = local_f0;
              if ((this->public_dependency_).total_size_ <= (this->public_dependency_).current_size_
                 ) {
                internal::LogMessage::LogMessage
                          (&local_a0,LOGLEVEL_DFATAL,
                           "/workspace/llm4binary/github/license_all_cmakelists_1510/chai2010[P]protorpc/./src/google/protobuf/repeated_field.h"
                           ,0x259);
                pLVar16 = internal::LogMessage::operator<<
                                    (&local_a0,"CHECK failed: (size()) < (Capacity()): ");
                internal::LogFinisher::operator=((LogFinisher *)&local_f0,pLVar16);
                internal::LogMessage::~LogMessage(&local_a0);
              }
              iVar5 = (this->public_dependency_).current_size_;
              (this->public_dependency_).current_size_ = iVar5 + 1;
              (this->public_dependency_).elements_[iVar5] = local_e8;
              iVar17 = iVar17 + -1;
            } while (1 < iVar17);
            bVar9 = true;
          }
        }
LAB_001e64c8:
        if (!bVar9) goto LAB_001e66a6;
LAB_001e64d0:
        puVar12 = input->buffer_;
      } while ((puVar12 < input->buffer_end_) && (*puVar12 == 'P'));
      puVar12 = input->buffer_;
      if ((puVar12 < input->buffer_end_) && (*puVar12 == 'X')) goto LAB_001e64fc;
    }
    goto LAB_001e5a45;
  case 10:
    if ((tag & 7) == 0) goto LAB_001e6372;
    if ((tag & 7) == 2) {
      bVar10 = internal::WireFormatLite::
               ReadPackedPrimitiveNoInline<int,(google::protobuf::internal::WireFormatLite::FieldType)5>
                         (input,local_e0);
      if (bVar10) goto LAB_001e64d0;
      goto LAB_001e66a6;
    }
    break;
  case 0xb:
    if ((tag & 7) == 0) goto LAB_001e6503;
    if ((tag & 7) == 2) {
      bVar10 = internal::WireFormatLite::
               ReadPackedPrimitiveNoInline<int,(google::protobuf::internal::WireFormatLite::FieldType)5>
                         (input,local_d8);
      if (bVar10) goto LAB_001e6667;
      goto LAB_001e66a6;
    }
  }
  if ((tag & 7) == 4) goto LAB_001e66ae;
  bVar10 = internal::WireFormat::SkipField(input,tag,local_a8);
  if (bVar10) goto LAB_001e5a45;
LAB_001e66a6:
  local_ec = 0;
  goto LAB_001e66ae;
LAB_001e64fc:
  do {
    input->buffer_ = puVar12 + 1;
LAB_001e6503:
    puVar12 = input->buffer_;
    if ((puVar12 < input->buffer_end_) && (uVar4 = *puVar12, -1 < (char)uVar4)) {
      input->buffer_ = puVar12 + 1;
      bVar10 = true;
      local_f0 = (int)(char)uVar4;
    }
    else {
      bVar10 = io::CodedInputStream::ReadVarint32Fallback(input,&local_f0);
    }
    bVar9 = false;
    if (bVar10 != false) {
      local_e4 = local_f0;
      iVar5 = (this->weak_dependency_).total_size_;
      if ((this->weak_dependency_).current_size_ == iVar5) {
        RepeatedField<int>::Reserve(local_d8,iVar5 + 1);
      }
      iVar5 = (this->weak_dependency_).current_size_;
      (this->weak_dependency_).current_size_ = iVar5 + 1;
      (this->weak_dependency_).elements_[iVar5] = local_e4;
      iVar5 = (this->weak_dependency_).total_size_;
      bVar9 = true;
      iVar6 = (this->weak_dependency_).current_size_;
      iVar17 = iVar5 - iVar6;
      if (iVar17 != 0 && iVar6 <= iVar5) {
        iVar17 = iVar17 + 1;
        do {
          puVar12 = input->buffer_;
          if ((input->buffer_end_ <= puVar12) || (*puVar12 != 'X')) break;
          puVar2 = puVar12 + 1;
          input->buffer_ = puVar2;
          if ((puVar2 < input->buffer_end_) && (uVar4 = *puVar2, -1 < (char)uVar4)) {
            input->buffer_ = puVar12 + 2;
            bVar10 = true;
            local_f0 = (int)(char)uVar4;
          }
          else {
            bVar10 = io::CodedInputStream::ReadVarint32Fallback(input,&local_f0);
          }
          if (bVar10 == false) {
            bVar9 = false;
            goto LAB_001e6663;
          }
          local_e4 = local_f0;
          if ((this->weak_dependency_).total_size_ <= (this->weak_dependency_).current_size_) {
            internal::LogMessage::LogMessage
                      (&local_68,LOGLEVEL_DFATAL,
                       "/workspace/llm4binary/github/license_all_cmakelists_1510/chai2010[P]protorpc/./src/google/protobuf/repeated_field.h"
                       ,0x259);
            pLVar16 = internal::LogMessage::operator<<
                                (&local_68,"CHECK failed: (size()) < (Capacity()): ");
            internal::LogFinisher::operator=((LogFinisher *)&local_f0,pLVar16);
            internal::LogMessage::~LogMessage(&local_68);
          }
          iVar5 = (this->weak_dependency_).current_size_;
          (this->weak_dependency_).current_size_ = iVar5 + 1;
          (this->weak_dependency_).elements_[iVar5] = local_e4;
          iVar17 = iVar17 + -1;
        } while (1 < iVar17);
        bVar9 = true;
      }
    }
LAB_001e6663:
    if (!bVar9) goto LAB_001e66a6;
LAB_001e6667:
    puVar12 = input->buffer_;
  } while ((puVar12 < input->buffer_end_) && (*puVar12 == 'X'));
  if ((input->buffer_ == input->buffer_end_) &&
     ((input->buffer_size_after_limit_ != 0 || (input->total_bytes_read_ == input->current_limit_)))
     ) {
    input->last_tag_ = 0;
    input->legitimate_message_end_ = true;
LAB_001e66ae:
    return SUB41(local_ec,0);
  }
  goto LAB_001e5a45;
}

Assistant:

bool FileDescriptorProto::MergePartialFromCodedStream(
    ::google::protobuf::io::CodedInputStream* input) {
#define DO_(EXPRESSION) if (!(EXPRESSION)) return false
  ::google::protobuf::uint32 tag;
  while ((tag = input->ReadTag()) != 0) {
    switch (::google::protobuf::internal::WireFormatLite::GetTagFieldNumber(tag)) {
      // optional string name = 1;
      case 1: {
        if (::google::protobuf::internal::WireFormatLite::GetTagWireType(tag) ==
            ::google::protobuf::internal::WireFormatLite::WIRETYPE_LENGTH_DELIMITED) {
          DO_(::google::protobuf::internal::WireFormatLite::ReadString(
                input, this->mutable_name()));
          ::google::protobuf::internal::WireFormat::VerifyUTF8String(
            this->name().data(), this->name().length(),
            ::google::protobuf::internal::WireFormat::PARSE);
        } else {
          goto handle_uninterpreted;
        }
        if (input->ExpectTag(18)) goto parse_package;
        break;
      }

      // optional string package = 2;
      case 2: {
        if (::google::protobuf::internal::WireFormatLite::GetTagWireType(tag) ==
            ::google::protobuf::internal::WireFormatLite::WIRETYPE_LENGTH_DELIMITED) {
         parse_package:
          DO_(::google::protobuf::internal::WireFormatLite::ReadString(
                input, this->mutable_package()));
          ::google::protobuf::internal::WireFormat::VerifyUTF8String(
            this->package().data(), this->package().length(),
            ::google::protobuf::internal::WireFormat::PARSE);
        } else {
          goto handle_uninterpreted;
        }
        if (input->ExpectTag(26)) goto parse_dependency;
        break;
      }

      // repeated string dependency = 3;
      case 3: {
        if (::google::protobuf::internal::WireFormatLite::GetTagWireType(tag) ==
            ::google::protobuf::internal::WireFormatLite::WIRETYPE_LENGTH_DELIMITED) {
         parse_dependency:
          DO_(::google::protobuf::internal::WireFormatLite::ReadString(
                input, this->add_dependency()));
          ::google::protobuf::internal::WireFormat::VerifyUTF8String(
            this->dependency(this->dependency_size() - 1).data(),
            this->dependency(this->dependency_size() - 1).length(),
            ::google::protobuf::internal::WireFormat::PARSE);
        } else {
          goto handle_uninterpreted;
        }
        if (input->ExpectTag(26)) goto parse_dependency;
        if (input->ExpectTag(34)) goto parse_message_type;
        break;
      }

      // repeated .google.protobuf.DescriptorProto message_type = 4;
      case 4: {
        if (::google::protobuf::internal::WireFormatLite::GetTagWireType(tag) ==
            ::google::protobuf::internal::WireFormatLite::WIRETYPE_LENGTH_DELIMITED) {
         parse_message_type:
          DO_(::google::protobuf::internal::WireFormatLite::ReadMessageNoVirtual(
                input, add_message_type()));
        } else {
          goto handle_uninterpreted;
        }
        if (input->ExpectTag(34)) goto parse_message_type;
        if (input->ExpectTag(42)) goto parse_enum_type;
        break;
      }

      // repeated .google.protobuf.EnumDescriptorProto enum_type = 5;
      case 5: {
        if (::google::protobuf::internal::WireFormatLite::GetTagWireType(tag) ==
            ::google::protobuf::internal::WireFormatLite::WIRETYPE_LENGTH_DELIMITED) {
         parse_enum_type:
          DO_(::google::protobuf::internal::WireFormatLite::ReadMessageNoVirtual(
                input, add_enum_type()));
        } else {
          goto handle_uninterpreted;
        }
        if (input->ExpectTag(42)) goto parse_enum_type;
        if (input->ExpectTag(50)) goto parse_service;
        break;
      }

      // repeated .google.protobuf.ServiceDescriptorProto service = 6;
      case 6: {
        if (::google::protobuf::internal::WireFormatLite::GetTagWireType(tag) ==
            ::google::protobuf::internal::WireFormatLite::WIRETYPE_LENGTH_DELIMITED) {
         parse_service:
          DO_(::google::protobuf::internal::WireFormatLite::ReadMessageNoVirtual(
                input, add_service()));
        } else {
          goto handle_uninterpreted;
        }
        if (input->ExpectTag(50)) goto parse_service;
        if (input->ExpectTag(58)) goto parse_extension;
        break;
      }

      // repeated .google.protobuf.FieldDescriptorProto extension = 7;
      case 7: {
        if (::google::protobuf::internal::WireFormatLite::GetTagWireType(tag) ==
            ::google::protobuf::internal::WireFormatLite::WIRETYPE_LENGTH_DELIMITED) {
         parse_extension:
          DO_(::google::protobuf::internal::WireFormatLite::ReadMessageNoVirtual(
                input, add_extension()));
        } else {
          goto handle_uninterpreted;
        }
        if (input->ExpectTag(58)) goto parse_extension;
        if (input->ExpectTag(66)) goto parse_options;
        break;
      }

      // optional .google.protobuf.FileOptions options = 8;
      case 8: {
        if (::google::protobuf::internal::WireFormatLite::GetTagWireType(tag) ==
            ::google::protobuf::internal::WireFormatLite::WIRETYPE_LENGTH_DELIMITED) {
         parse_options:
          DO_(::google::protobuf::internal::WireFormatLite::ReadMessageNoVirtual(
               input, mutable_options()));
        } else {
          goto handle_uninterpreted;
        }
        if (input->ExpectTag(74)) goto parse_source_code_info;
        break;
      }

      // optional .google.protobuf.SourceCodeInfo source_code_info = 9;
      case 9: {
        if (::google::protobuf::internal::WireFormatLite::GetTagWireType(tag) ==
            ::google::protobuf::internal::WireFormatLite::WIRETYPE_LENGTH_DELIMITED) {
         parse_source_code_info:
          DO_(::google::protobuf::internal::WireFormatLite::ReadMessageNoVirtual(
               input, mutable_source_code_info()));
        } else {
          goto handle_uninterpreted;
        }
        if (input->ExpectTag(80)) goto parse_public_dependency;
        break;
      }

      // repeated int32 public_dependency = 10;
      case 10: {
        if (::google::protobuf::internal::WireFormatLite::GetTagWireType(tag) ==
            ::google::protobuf::internal::WireFormatLite::WIRETYPE_VARINT) {
         parse_public_dependency:
          DO_((::google::protobuf::internal::WireFormatLite::ReadRepeatedPrimitive<
                   ::google::protobuf::int32, ::google::protobuf::internal::WireFormatLite::TYPE_INT32>(
                 1, 80, input, this->mutable_public_dependency())));
        } else if (::google::protobuf::internal::WireFormatLite::GetTagWireType(tag)
                   == ::google::protobuf::internal::WireFormatLite::
                      WIRETYPE_LENGTH_DELIMITED) {
          DO_((::google::protobuf::internal::WireFormatLite::ReadPackedPrimitiveNoInline<
                   ::google::protobuf::int32, ::google::protobuf::internal::WireFormatLite::TYPE_INT32>(
                 input, this->mutable_public_dependency())));
        } else {
          goto handle_uninterpreted;
        }
        if (input->ExpectTag(80)) goto parse_public_dependency;
        if (input->ExpectTag(88)) goto parse_weak_dependency;
        break;
      }

      // repeated int32 weak_dependency = 11;
      case 11: {
        if (::google::protobuf::internal::WireFormatLite::GetTagWireType(tag) ==
            ::google::protobuf::internal::WireFormatLite::WIRETYPE_VARINT) {
         parse_weak_dependency:
          DO_((::google::protobuf::internal::WireFormatLite::ReadRepeatedPrimitive<
                   ::google::protobuf::int32, ::google::protobuf::internal::WireFormatLite::TYPE_INT32>(
                 1, 88, input, this->mutable_weak_dependency())));
        } else if (::google::protobuf::internal::WireFormatLite::GetTagWireType(tag)
                   == ::google::protobuf::internal::WireFormatLite::
                      WIRETYPE_LENGTH_DELIMITED) {
          DO_((::google::protobuf::internal::WireFormatLite::ReadPackedPrimitiveNoInline<
                   ::google::protobuf::int32, ::google::protobuf::internal::WireFormatLite::TYPE_INT32>(
                 input, this->mutable_weak_dependency())));
        } else {
          goto handle_uninterpreted;
        }
        if (input->ExpectTag(88)) goto parse_weak_dependency;
        if (input->ExpectAtEnd()) return true;
        break;
      }

      default: {
      handle_uninterpreted:
        if (::google::protobuf::internal::WireFormatLite::GetTagWireType(tag) ==
            ::google::protobuf::internal::WireFormatLite::WIRETYPE_END_GROUP) {
          return true;
        }
        DO_(::google::protobuf::internal::WireFormat::SkipField(
              input, tag, mutable_unknown_fields()));
        break;
      }
    }
  }
  return true;
#undef DO_
}